

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_avx2.c
# Opt level: O3

uint aom_highbd_obmc_sad4x4_avx2(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  ulong *puVar4;
  bool bVar5;
  long lVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  
  puVar4 = (ulong *)((long)pre * 2);
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  lVar6 = 0;
  auVar8._8_4_ = 0x800;
  auVar8._0_8_ = 0x80000000800;
  auVar8._12_4_ = 0x800;
  auVar8._16_4_ = 0x800;
  auVar8._20_4_ = 0x800;
  auVar8._24_4_ = 0x800;
  auVar8._28_4_ = 0x800;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)((long)puVar4 + (long)pre_stride * 2);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *puVar4;
    auVar9 = vpunpcklqdq_avx(auVar11,auVar9);
    auVar10 = vlddqu_avx(*(undefined1 (*) [32])(mask + lVar6));
    auVar1 = vlddqu_avx(*(undefined1 (*) [32])(wsrc + lVar6));
    auVar2 = vpmovzxwd_avx2(auVar9);
    auVar10 = vpmaddwd_avx2(auVar2,auVar10);
    auVar10 = vpsubd_avx2(auVar1,auVar10);
    auVar10 = vpabsd_avx2(auVar10);
    auVar10 = vpaddd_avx2(auVar10,auVar8);
    auVar10 = vpsrld_avx2(auVar10,0xc);
    auVar10 = vpaddd_avx2(auVar10,auVar7._0_32_);
    auVar7 = ZEXT3264(auVar10);
    puVar4 = (ulong *)((long)puVar4 + (long)(pre_stride * 2) * 2);
    lVar6 = 8;
    bVar3 = false;
  } while (bVar5);
  auVar9 = vpaddd_avx(auVar10._0_16_,auVar10._16_16_);
  auVar9 = vphaddd_avx(auVar9,auVar9);
  auVar9 = vphaddd_avx(auVar9,auVar9);
  return auVar9._0_4_;
}

Assistant:

static inline unsigned int hbd_obmc_sad_w4_avx2(const uint8_t *pre8,
                                                const int pre_stride,
                                                const int32_t *wsrc,
                                                const int32_t *mask,
                                                const int height) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  int n = 0;
  __m256i v_sad_d = _mm256_setzero_si256();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);
  do {
    const __m128i v_p_w_0 = xx_loadl_64(pre);
    const __m128i v_p_w_1 = xx_loadl_64(pre + pre_stride);
    const __m128i v_p_w = _mm_unpacklo_epi64(v_p_w_0, v_p_w_1);
    const __m256i v_m_d = _mm256_lddqu_si256((__m256i *)(mask + n));
    const __m256i v_w_d = _mm256_lddqu_si256((__m256i *)(wsrc + n));

    const __m256i v_p_d = _mm256_cvtepu16_epi32(v_p_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m256i v_pm_d = _mm256_madd_epi16(v_p_d, v_m_d);

    const __m256i v_diff_d = _mm256_sub_epi32(v_w_d, v_pm_d);
    const __m256i v_absdiff_d = _mm256_abs_epi32(v_diff_d);

    // Rounded absolute difference

    const __m256i v_tmp_d = _mm256_add_epi32(v_absdiff_d, v_bias_d);
    const __m256i v_rad_d = _mm256_srli_epi32(v_tmp_d, 12);

    v_sad_d = _mm256_add_epi32(v_sad_d, v_rad_d);

    n += 8;

    pre += pre_stride << 1;
  } while (n < 8 * (height >> 1));

  __m128i v_sad_d_0 = _mm256_castsi256_si128(v_sad_d);
  __m128i v_sad_d_1 = _mm256_extracti128_si256(v_sad_d, 1);
  v_sad_d_0 = _mm_add_epi32(v_sad_d_0, v_sad_d_1);
  return xx_hsum_epi32_si32(v_sad_d_0);
}